

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QMap<int,_QByteArray> parseTzAbbreviations(QDataStream *ds,int tzh_charcnt,QList<QTzType> *types)

{
  long lVar1;
  char ch_00;
  bool bVar2;
  bool bVar3;
  Status SVar4;
  QByteArray *this;
  long in_RCX;
  uint uVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  QDataStream *this_00;
  long lVar7;
  long in_FS_OFFSET;
  quint8 ch;
  uint local_7c;
  QByteArray local_78;
  QByteArray local_58;
  qint8 local_39;
  long local_38;
  
  this_00 = (QDataStream *)CONCAT44(in_register_00000034,tzh_charcnt);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  ds->d = (void *)0x0;
  local_39 = -0x56;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  bVar2 = true;
  if (0 < (int)types) {
    uVar6 = (ulong)types & 0xffffffff;
    do {
      SVar4 = QDataStream::status(this_00);
      if (SVar4 != Ok) {
        bVar3 = false;
        goto LAB_00409bd0;
      }
      QDataStream::operator>>(this_00,&local_39);
      SVar4 = QDataStream::status(this_00);
      if (SVar4 != Ok) {
        bVar3 = true;
        bVar2 = false;
        goto LAB_00409bd0;
      }
      QByteArray::append(&local_58,local_39);
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
    bVar3 = false;
    bVar2 = true;
  }
LAB_00409bd0:
  if (bVar2) {
    if (*(long *)(in_RCX + 0x10) != 0) {
      lVar7 = *(long *)(in_RCX + 8);
      lVar1 = lVar7 + *(long *)(in_RCX + 0x10) * 8;
      do {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = (char *)0x0;
        local_78.d.size = 0;
        uVar6 = (ulong)*(byte *)(lVar7 + 5);
        ch_00 = local_58.d.ptr[uVar6];
        while (ch_00 != '\0') {
          uVar6 = uVar6 + 1;
          QByteArray::append(&local_78,ch_00);
          ch_00 = local_58.d.ptr[uVar6];
        }
        local_7c = (uint)*(byte *)(lVar7 + 5);
        this = QMap<int,_QByteArray>::operator[]((QMap<int,_QByteArray> *)ds,(int *)&local_7c);
        QByteArray::operator=(this,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != lVar1);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (!bVar3) {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                  *)ds);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
              )ds;
  }
  __stack_chk_fail();
}

Assistant:

static QMap<int, QByteArray> parseTzAbbreviations(QDataStream &ds, int tzh_charcnt, const QList<QTzType> &types)
{
    // Parse the abbreviation list which is tzh_charcnt long with '\0' separated strings. The
    // QTzType.tz_abbrind index points to the first char of the abbreviation in the array, not the
    // occurrence in the list. It can also point to a partial string so we need to use the actual typeList
    // index values when parsing.  By using a map with tz_abbrind as ordered key we get both index
    // methods in one data structure and can convert the types afterwards.
    QMap<int, QByteArray> map;
    quint8 ch;
    QByteArray input;
    // First parse the full abbrev string
    for (int i = 0; i < tzh_charcnt && ds.status() == QDataStream::Ok; ++i) {
        ds >> ch;
        if (ds.status() == QDataStream::Ok)
            input.append(char(ch));
        else
            return map;
    }
    // Then extract all the substrings pointed to by types
    for (const QTzType &type : types) {
        QByteArray abbrev;
        for (int i = type.tz_abbrind; input.at(i) != '\0'; ++i)
            abbrev.append(input.at(i));
        // Have reached end of an abbreviation, so add to map
        map[type.tz_abbrind] = abbrev;
    }
    return map;
}